

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O2

bool crnlib::string_to_float(char **p,float *value,uint round_digit)

{
  bool bVar1;
  float fVar2;
  double d;
  double local_10;
  
  bVar1 = string_to_double(p,&local_10,round_digit);
  if (bVar1) {
    fVar2 = (float)local_10;
  }
  else {
    fVar2 = 0.0;
  }
  *value = fVar2;
  return bVar1;
}

Assistant:

bool string_to_float(const char*& p, float& value, uint round_digit) {
  double d;
  if (!string_to_double(p, d, round_digit)) {
    value = 0;
    return false;
  }
  value = static_cast<float>(d);
  return true;
}